

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O3

bool slang::ast::requireLValueHelper<slang::ast::ElementSelectExpression>
               (ElementSelectExpression *expr,ASTContext *context,SourceLocation location,
               bitmask<slang::ast::AssignFlags> flags,Expression *longestStaticPrefix)

{
  ExpressionKind EVar1;
  Expression *this;
  int *piVar2;
  char cVar3;
  bool bVar4;
  Diagnostic *pDVar5;
  Type *this_00;
  DiagCode code;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  *context_00;
  ElementSelectExpression *pEVar6;
  EvalContext evalCtx;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_388;
  TempVarSymbol *local_368;
  RandomizeDetails *pRStack_360;
  AssertionInstanceDetails *local_358;
  undefined1 local_350;
  undefined8 local_34c;
  undefined8 uStack_344;
  undefined4 local_33c;
  SmallVectorBase<slang::ast::EvalContext::Frame> local_338;
  LValue **local_280;
  undefined8 local_278;
  undefined8 local_270;
  LValue *local_268 [5];
  SmallVectorBase<slang::Diagnostic> local_240;
  SmallVectorBase<slang::Diagnostic> local_148;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined1 local_40;
  
  this = expr->value_;
  EVar1 = this->kind;
  if ((EVar1 == Streaming) || (EVar1 == Concatenation)) {
    if (((ulong)location & 0xfffffff) == 0) {
      location = (expr->super_Expression).sourceRange.startLoc;
    }
    code.subsystem = Expressions;
    code.code = 0x56;
LAB_004debf6:
    pDVar5 = ASTContext::addDiag(context,code,location);
    Diagnostic::operator<<(pDVar5,(expr->super_Expression).sourceRange);
LAB_004dec0e:
    bVar4 = false;
  }
  else {
    if ((EVar1 & ~IntegerLiteral) == NamedValue) {
      piVar2 = *(int **)(this + 1);
      if ((*piVar2 == 0x3b) && (*(int *)(*(long *)(piVar2 + 0x54) + 0x80) == 0xe)) {
        pDVar5 = ASTContext::addDiag(context,(DiagCode)0xa80007,(expr->super_Expression).sourceRange
                                    );
        Diagnostic::operator<<(pDVar5,*(string_view *)(piVar2 + 2));
        goto LAB_004dec0e;
      }
      if ((flags.m_bits & 1) != 0) {
        this_00 = DeclaredType::getType((DeclaredType *)(piVar2 + 0x10));
        bVar4 = Type::isDynamicallySizedArray(this_00);
        if (bVar4) {
          if (((ulong)location & 0xfffffff) == 0) {
            location = (expr->super_Expression).sourceRange.startLoc;
          }
          code.subsystem = Expressions;
          code.code = 0x82;
          goto LAB_004debf6;
        }
      }
    }
    if (((context->flags).m_bits & 0x20) == 0) {
      local_358 = context->assertionInstance;
      local_338.data_ = (pointer)local_338.firstElement;
      local_388._0_8_ = (context->scope).ptr;
      local_388._8_8_ = *(undefined8 *)&context->lookupIndex;
      local_388._16_8_ = (context->flags).m_bits;
      local_388._24_8_ = context->instanceOrProc;
      local_368 = context->firstTempVar;
      pRStack_360 = context->randomizeDetails;
      local_350 = 2;
      local_34c = 0;
      uStack_344 = 0;
      local_33c = 0;
      local_338.len = 0;
      local_338.cap = 2;
      local_278 = 0;
      local_270 = 5;
      local_240.data_ = (pointer)local_240.firstElement;
      local_240.len = 0;
      local_240.cap = 2;
      local_148.data_ = (pointer)local_148.firstElement;
      local_148.len = 0;
      local_148.cap = 2;
      local_50 = 0;
      uStack_48 = 0;
      local_40 = 0;
      context_00 = &local_388;
      local_280 = local_268;
      bVar4 = ElementSelectExpression::isConstantSelect(expr,(EvalContext *)context_00);
      pEVar6 = expr;
      if (longestStaticPrefix != (Expression *)0x0) {
        pEVar6 = (ElementSelectExpression *)longestStaticPrefix;
      }
      expr = (ElementSelectExpression *)0x0;
      if (bVar4) {
        expr = pEVar6;
      }
      SmallVectorBase<slang::Diagnostic>::cleanup(&local_148,(EVP_PKEY_CTX *)context_00);
      SmallVectorBase<slang::Diagnostic>::cleanup(&local_240,(EVP_PKEY_CTX *)context_00);
      if (local_280 != local_268) {
        operator_delete(local_280);
      }
      SmallVectorBase<slang::ast::EvalContext::Frame>::cleanup
                (&local_338,(EVP_PKEY_CTX *)context_00);
    }
    else {
      ASTContext::eval((ConstantValue *)&local_388,context,expr->selector_,
                       (bitmask<slang::ast::EvalFlags>)0x0);
      cVar3 = (char)local_368;
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           *)&local_388);
      if (cVar3 == '\0') {
        return false;
      }
      if (longestStaticPrefix != (Expression *)0x0) {
        expr = (ElementSelectExpression *)longestStaticPrefix;
      }
    }
    bVar4 = Expression::requireLValue(this,context,location,flags,&expr->super_Expression);
  }
  return bVar4;
}

Assistant:

bool requireLValueHelper(const T& expr, const ASTContext& context, SourceLocation location,
                         bitmask<AssignFlags> flags, const Expression* longestStaticPrefix) {
    auto& val = expr.value();
    if (val.kind == ExpressionKind::Concatenation || val.kind == ExpressionKind::Streaming) {
        // Selects of concatenations are not allowed to be lvalues.
        if (!location)
            location = expr.sourceRange.start();

        auto& diag = context.addDiag(diag::ExpressionNotAssignable, location);
        diag << expr.sourceRange;
        return false;
    }

    if (ValueExpressionBase::isKind(val.kind)) {
        auto& sym = val.template as<ValueExpressionBase>().symbol;
        if (sym.kind == SymbolKind::Net) {
            if (sym.template as<NetSymbol>().netType.netKind == NetType::UserDefined) {
                context.addDiag(diag::UserDefPartialDriver, expr.sourceRange) << sym.name;
                return false;
            }
        }

        if (flags.has(AssignFlags::NonBlocking) && sym.getType().isDynamicallySizedArray()) {
            if (!location)
                location = expr.sourceRange.start();

            context.addDiag(diag::NonblockingDynamicAssign, location) << expr.sourceRange;
            return false;
        }
    }

    if (context.flags.has(ASTFlags::NonProcedural)) {
        if constexpr (std::is_same_v<T, RangeSelectExpression>) {
            if (!context.eval(expr.left()) || !context.eval(expr.right()))
                return false;
        }
        else {
            if (!context.eval(expr.selector()))
                return false;
        }

        if (!longestStaticPrefix)
            longestStaticPrefix = &expr;
    }
    else {
        EvalContext evalCtx(context, EvalFlags::CacheResults);
        if (expr.isConstantSelect(evalCtx)) {
            if (!longestStaticPrefix)
                longestStaticPrefix = &expr;
        }
        else {
            longestStaticPrefix = nullptr;
        }
    }

    return val.requireLValue(context, location, flags, longestStaticPrefix);
}